

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O1

void __thiscall Rml::Element::ScrollTo(Element *this,Vector2f offset,ScrollBehavior behavior)

{
  Vector2f delta_offset;
  ElementDocument *this_00;
  Context *this_01;
  float fStack_24;
  
  fStack_24 = offset.y;
  if (behavior != Instant) {
    this_00 = GetOwnerDocument(this);
    if (this_00 == (ElementDocument *)0x0) {
      this_01 = (Context *)0x0;
    }
    else {
      this_01 = ElementDocument::GetContext(this_00);
    }
    if (this_01 != (Context *)0x0) {
      delta_offset.y = fStack_24 - (this->scroll_offset).y;
      delta_offset.x = offset.x - (this->scroll_offset).x;
      Context::PerformSmoothscrollOnTarget(this_01,this,delta_offset,behavior);
      return;
    }
  }
  SetScrollLeft(this,offset.x);
  SetScrollTop(this,fStack_24);
  return;
}

Assistant:

void Element::ScrollTo(Vector2f offset, ScrollBehavior behavior)
{
	if (behavior != ScrollBehavior::Instant)
	{
		if (Context* context = GetContext())
		{
			context->PerformSmoothscrollOnTarget(this, offset - scroll_offset, behavior);
			return;
		}
	}

	SetScrollLeft(offset.x);
	SetScrollTop(offset.y);
}